

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O3

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeStringValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  idx_t *piVar1;
  data_ptr_t pdVar2;
  idx_t size;
  Vector *this;
  idx_t iVar3;
  data_ptr_t pdVar4;
  idx_t iVar5;
  long lVar6;
  long *plVar7;
  idx_t i;
  ulong uVar8;
  ulong uVar9;
  string_t sVar10;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  size = ListVector::GetListSize(result);
  if (count == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    iVar3 = 0;
    do {
      iVar5 = iVar3;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar5 = (idx_t)(local_78.sel)->sel_vector[iVar3];
      }
      if (**(long **)(local_78.data + iVar5 * 8) != 0) {
        lVar6 = lVar6 + *(long *)(**(long **)(local_78.data + iVar5 * 8) + 0x20);
      }
      iVar3 = iVar3 + 1;
    } while (count != iVar3);
  }
  ListVector::Reserve(result,lVar6 + size);
  this = ListVector::GetEntry(result);
  if (count != 0) {
    pdVar2 = result->data;
    uVar8 = 0;
    do {
      uVar9 = uVar8;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar9 = (ulong)(local_78.sel)->sel_vector[uVar8];
      }
      plVar7 = *(long **)(local_78.data + uVar9 * 8);
      pdVar4 = (data_ptr_t)(uVar8 * 0x10);
      piVar1 = (idx_t *)(pdVar2 + (long)pdVar4);
      *(idx_t *)(pdVar2 + (long)pdVar4) = size;
      if (*plVar7 == 0) {
        iVar3 = 0;
      }
      else {
        plVar7 = *(long **)(*plVar7 + 0x18);
        iVar5 = size;
        if (plVar7 != (long *)0x0) {
          uVar9 = size << 4 | 8;
          do {
            sVar10.value.pointer.ptr = (char *)pdVar4;
            sVar10.value._0_8_ = plVar7[2];
            sVar10 = StringVector::AddStringOrBlob((StringVector *)this,(Vector *)plVar7[1],sVar10);
            pdVar4 = this->data;
            *(long *)(pdVar4 + (uVar9 - 8)) = sVar10.value._0_8_;
            *(long *)(pdVar4 + uVar9) = sVar10.value._8_8_;
            iVar5 = iVar5 + 1;
            plVar7 = (long *)*plVar7;
            uVar9 = uVar9 + 0x10;
          } while (plVar7 != (long *)0x0);
          size = *piVar1;
        }
        iVar3 = iVar5 - size;
        size = iVar5;
      }
      piVar1[1] = iVar3;
      uVar8 = uVar8 + 1;
    } while (uVar8 != count);
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}